

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_NodalProjector.cpp
# Opt level: O0

void __thiscall
Hydro::NodalProjector::project
          (NodalProjector *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_phi
          ,Real a_rtol,Real a_atol)

{
  MultiFab *dst;
  MultiFab *pMVar1;
  long lVar2;
  Long LVar3;
  MultiFab **ppMVar4;
  FabArrayBase *pFVar5;
  MultiFab *in_RDI;
  int lev_1;
  int lev;
  char *in_stack_00000198;
  int in_stack_000001a4;
  char *in_stack_000001a8;
  char *in_stack_000001b0;
  Real in_stack_000008d0;
  Real in_stack_000008d8;
  NodalProjector *in_stack_000008e0;
  MultiFab *in_stack_ffffffffffffff78;
  MultiFab *in_stack_ffffffffffffff80;
  MultiFab *in_stack_ffffffffffffff98;
  int local_48;
  int local_44;
  
  dst = (MultiFab *)
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::size
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x9f5121);
  pMVar1 = (MultiFab *)
           amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::size
                     ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x9f5137);
  if (dst != pMVar1) {
    amrex::Assert_host(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4,in_stack_00000198);
  }
  local_44 = 0;
  while( true ) {
    lVar2 = (long)local_44;
    LVar3 = amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::size
                      ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x9f51b0);
    if (LVar3 <= lVar2) break;
    amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
              ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
               in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    ppMVar4 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff98 = *ppMVar4;
    pFVar5 = (FabArrayBase *)
             amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                       ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                        in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    amrex::FabArrayBase::nGrow(pFVar5,0);
    amrex::MultiFab::Copy
              (dst,in_RDI,(int)((ulong)lVar2 >> 0x20),(int)lVar2,
               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
    local_44 = local_44 + 1;
  }
  project(in_stack_000008e0,in_stack_000008d8,in_stack_000008d0);
  for (local_48 = 0;
      LVar3 = amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::size
                        ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x9f5274),
      local_48 < LVar3; local_48 = local_48 + 1) {
    ppMVar4 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff78 = *ppMVar4;
    in_stack_ffffffffffffff80 =
         amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                   ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                    in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    pFVar5 = (FabArrayBase *)
             amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                       ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                        in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    amrex::FabArrayBase::nGrow(pFVar5,0);
    amrex::MultiFab::Copy
              (dst,in_RDI,(int)((ulong)lVar2 >> 0x20),(int)lVar2,
               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void
NodalProjector::project ( const Vector<MultiFab*>& a_phi, Real a_rtol, Real a_atol )
{
    AMREX_ALWAYS_ASSERT(a_phi.size()==m_phi.size());

    for (int lev=0; lev < m_phi.size(); ++lev )
    {
        MultiFab::Copy(m_phi[lev],*a_phi[lev],0,0,1,m_phi[lev].nGrow());
    }

    project(a_rtol, a_atol);

    for (int lev=0; lev < m_phi.size(); ++lev )
    {
        MultiFab::Copy(*a_phi[lev],m_phi[lev],0,0,1,m_phi[lev].nGrow());
    }
}